

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DescriptorPoolManager.hpp
# Opt level: O3

DescriptorSetAllocation * __thiscall
Diligent::DescriptorSetAllocation::operator=
          (DescriptorSetAllocation *this,DescriptorSetAllocation *rhs)

{
  VkDescriptorPool pVVar1;
  
  Release(this);
  this->CmdQueueMask = rhs->CmdQueueMask;
  pVVar1 = rhs->Pool;
  this->Set = rhs->Set;
  this->Pool = pVVar1;
  this->DescrSetAllocator = rhs->DescrSetAllocator;
  rhs->CmdQueueMask = 0;
  rhs->DescrSetAllocator = (DescriptorSetAllocator *)0x0;
  rhs->Set = (VkDescriptorSet)0x0;
  rhs->Pool = (VkDescriptorPool)0x0;
  return this;
}

Assistant:

DescriptorSetAllocation& operator=(DescriptorSetAllocation&& rhs) noexcept
    {
        Release();

        Set               = rhs.Set;
        CmdQueueMask      = rhs.CmdQueueMask;
        Pool              = rhs.Pool;
        DescrSetAllocator = rhs.DescrSetAllocator;

        rhs.Reset();

        return *this;
    }